

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

bool __thiscall
Lib::
FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>_>
::hasNext(FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>_>
          *this)

{
  bool bVar1;
  long in_RDI;
  Option<Lib::VirtualIterator<std::tuple<>_>_> *in_stack_ffffffffffffff98;
  Option<Lib::VirtualIterator<std::tuple<>_>_> *in_stack_ffffffffffffffa0;
  MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>
  *in_stack_ffffffffffffffc8;
  
  while( true ) {
    bVar1 = OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::isSome
                      ((OptionBase<Lib::VirtualIterator<std::tuple<>_>_> *)(in_RDI + 0x10));
    if (!bVar1) {
      return false;
    }
    Option<Lib::VirtualIterator<std::tuple<>_>_>::operator->
              ((Option<Lib::VirtualIterator<std::tuple<>_>_> *)0x89f998);
    bVar1 = VirtualIterator<std::tuple<>_>::hasNext((VirtualIterator<std::tuple<>_> *)0x89f9a0);
    if (bVar1) break;
    bVar1 = MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>
            ::hasNext((MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>
                       *)0x89f9ba);
    if (bVar1) {
      in_stack_ffffffffffffffa0 =
           (Option<Lib::VirtualIterator<std::tuple<>_>_> *)&stack0xffffffffffffffc8;
      MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>
      ::next(in_stack_ffffffffffffffc8);
      move_if_value<Lib::VirtualIterator<std::tuple<>_>,_true>
                ((VirtualIterator<std::tuple<>_> *)in_stack_ffffffffffffff98);
      Option<Lib::VirtualIterator<std::tuple<>_>_>::OptionBase
                (in_stack_ffffffffffffffa0,
                 (VirtualIterator<std::tuple<>_> *)in_stack_ffffffffffffff98);
    }
    else {
      Option<Lib::VirtualIterator<std::tuple<>_>_>::Option
                ((Option<Lib::VirtualIterator<std::tuple<>_>_> *)0x89fa1e);
    }
    Option<Lib::VirtualIterator<std::tuple<>_>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Option<Lib::VirtualIterator<std::tuple<>_>_>::~Option
              ((Option<Lib::VirtualIterator<std::tuple<>_>_> *)0x89fa41);
    if (bVar1) {
      VirtualIterator<std::tuple<>_>::~VirtualIterator
                ((VirtualIterator<std::tuple<>_> *)in_stack_ffffffffffffffa0);
      VirtualIterator<std::tuple<>_>::~VirtualIterator
                ((VirtualIterator<std::tuple<>_> *)in_stack_ffffffffffffffa0);
    }
  }
  return true;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }